

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_write(PgHdr *pPg)

{
  u32 i;
  Pgno PVar1;
  Pager *pPager;
  sqlite3_vfs *psVar2;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  int iVar6;
  MemJournal *p;
  Bitvec *pBVar7;
  undefined4 uVar8;
  
  pPager = pPg->pPager;
  if (pPager->eState != '\x02') goto LAB_001326e9;
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
    psVar2 = pPager->pVfs;
    PVar1 = pPager->dbSize;
    pBVar7 = (Bitvec *)sqlite3Malloc(0x200);
    if (pBVar7 == (Bitvec *)0x0) {
      pPager->pInJournal = (Bitvec *)0x0;
      return 7;
    }
    memset(&pBVar7->nSet,0,0x1fc);
    pBVar7->iSize = PVar1;
    pPager->pInJournal = pBVar7;
    psVar3 = pPager->jfd;
    if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
      if (pPager->journalMode == '\x04') {
        psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[1].pMethods = (sqlite3_io_methods *)0xffffffff000003f8;
        psVar3->pMethods = &MemJournalMethods;
        psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
        psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
      }
      else {
        if (pPager->tempFile == '\0') {
          iVar5 = 0;
          uVar8 = 0x806;
        }
        else {
          uVar8 = 0x100e;
          iVar5 = sqlite3Config.nStmtSpill;
        }
        iVar6 = databaseIsUnmoved(pPager);
        if (iVar6 == 0) {
          psVar3 = pPager->jfd;
          psVar4 = (sqlite3_io_methods *)pPager->zJournal;
          psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
          psVar3[1].pMethods = (sqlite3_io_methods *)0x0;
          if (iVar5 != 0) {
            iVar6 = 0x3f8;
            if (0 < iVar5) {
              iVar6 = iVar5;
            }
            *(int *)&psVar3[1].pMethods = iVar6;
            psVar3->pMethods = &MemJournalMethods;
            *(int *)((long)&psVar3[1].pMethods + 4) = iVar5;
            *(undefined4 *)&psVar3[7].pMethods = uVar8;
            psVar3[9].pMethods = psVar4;
            psVar3[8].pMethods = (sqlite3_io_methods *)psVar2;
            goto LAB_0013286b;
          }
          iVar6 = (*psVar2->xOpen)((sqlite3_file *)psVar2,(int)psVar4);
        }
        if (iVar6 != 0) goto LAB_0013288f;
      }
    }
LAB_0013286b:
    pPager->nRec = 0;
    pPager->setSuper = '\0';
    pPager->journalOff = 0;
    pPager->journalHdr = 0;
    iVar6 = writeJournalHdr(pPager);
    if (iVar6 != 0) {
LAB_0013288f:
      sqlite3BitvecDestroy(pPager->pInJournal);
      pPager->pInJournal = (Bitvec *)0x0;
      pPager->journalOff = 0;
      return iVar6;
    }
  }
  pPager->eState = '\x03';
LAB_001326e9:
  sqlite3PcacheMakeDirty(pPg);
  if (pPager->pInJournal != (Bitvec *)0x0) {
    i = pPg->pgno;
    iVar5 = sqlite3BitvecTestNotNull(pPager->pInJournal,i);
    if (iVar5 == 0) {
      if (pPager->dbOrigSize < i) {
        if (pPager->eState != '\x04') {
          *(byte *)&pPg->flags = (byte)pPg->flags | 8;
        }
      }
      else {
        iVar5 = pagerAddPageToRollbackJournal(pPg);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
    }
  }
  *(byte *)&pPg->flags = (byte)pPg->flags | 4;
  if (pPager->nSavepoint < 1) {
    iVar5 = 0;
  }
  else {
    iVar5 = subjournalPageIfRequired(pPg);
  }
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return iVar5;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );
  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page.
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page that is about to be modified as dirty. */
  sqlite3PcacheMakeDirty(pPg);

  /* If a rollback journal is in use, them make sure the page that is about
  ** to change is in the rollback journal, or if the page is a new page off
  ** then end of the file, make sure it is marked as PGHDR_NEED_SYNC.
  */
  assert( (pPager->pInJournal!=0) == isOpen(pPager->jfd) );
  if( pPager->pInJournal!=0
   && sqlite3BitvecTestNotNull(pPager->pInJournal, pPg->pgno)==0
  ){
    assert( pagerUseWal(pPager)==0 );
    if( pPg->pgno<=pPager->dbOrigSize ){
      rc = pagerAddPageToRollbackJournal(pPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      if( pPager->eState!=PAGER_WRITER_DBMOD ){
        pPg->flags |= PGHDR_NEED_SYNC;
      }
      PAGERTRACE(("APPEND %d page %d needSync=%d\n",
              PAGERID(pPager), pPg->pgno,
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
    }
  }

  /* The PGHDR_DIRTY bit is set above when the page was added to the dirty-list
  ** and before writing the page into the rollback journal.  Wait until now,
  ** after the page has been successfully journalled, before setting the
  ** PGHDR_WRITEABLE bit that indicates that the page can be safely modified.
  */
  pPg->flags |= PGHDR_WRITEABLE;

  /* If the statement journal is open and the page is not in it,
  ** then write the page into the statement journal.
  */
  if( pPager->nSavepoint>0 ){
    rc = subjournalPageIfRequired(pPg);
  }

  /* Update the database size and return. */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}